

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_helper.c
# Opt level: O3

void helper_crypto_sha1h_aarch64(void *vd,void *vm)

{
  *(ulong *)vd = (ulong)(*vm << 0x1e | *vm >> 2);
  *(undefined8 *)((long)vd + 8) = 0;
  return;
}

Assistant:

void HELPER(crypto_sha1h)(void *vd, void *vm)
{
    uint64_t *rd = vd;
    uint64_t *rm = vm;
    union CRYPTO_STATE m = { .l = { rm[0], rm[1] } };

    CR_ST_WORD(m, 0) = ror32(CR_ST_WORD(m, 0), 2);
    CR_ST_WORD(m, 1) = CR_ST_WORD(m, 2) = CR_ST_WORD(m, 3) = 0;

    rd[0] = m.l[0];
    rd[1] = m.l[1];
}